

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O3

void __thiscall
linkedList<myString>::linkedList(linkedList<myString> *this,linkedList<myString> *rhs)

{
  myString *pmVar1;
  myString item;
  myString local_50;
  myString local_38;
  
  this->_vptr_linkedList = (_func_int **)&PTR__linkedList_0010ea48;
  pmVar1 = (myString *)&rhs->head;
  this->head = (l_node<myString> *)0x0;
  this->tail = (l_node<myString> *)0x0;
  this->size = 0;
  do {
    pmVar1 = (myString *)pmVar1->_vptr_myString;
    myString::myString(&local_38,pmVar1);
    myString::myString(&local_50,&local_38);
    insert_last(this,&local_50);
    myString::~myString(&local_50);
    myString::~myString(&local_38);
    pmVar1 = pmVar1 + 1;
  } while( true );
}

Assistant:

linkedList<T>::linkedList(linkedList &rhs) {



//    this->clear(); // the function at the start of this review
    this->head = nullptr;
    this->tail= nullptr;

    for ( auto item : rhs) {
        this->insert_last(item);

    }


}